

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadePrimitives
          (VertexVaryingShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets
          ,int numPackets,int invocationID)

{
  int iVar1;
  VertexPacket *pVVar2;
  GeometryEmitter *this_00;
  PrimitivePacket *pPVar3;
  int verticeNdx;
  ulong uVar4;
  ulong uVar5;
  VertexPacket **ppVVar6;
  Vec4 inputColor;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  PrimitivePacket *local_d8;
  GeometryEmitter *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_3_1194ccdc_for_v local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  PrimitivePacket *local_98;
  ulong local_90;
  Vector<float,_4> local_88;
  ulong local_78;
  ulong local_70;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  tcu local_40 [16];
  
  local_88.m_data[0] = -0.2;
  local_88.m_data[1] = -0.2;
  local_88.m_data[2] = 0.0;
  local_88.m_data[3] = 0.0;
  local_d0 = output;
  local_98 = packets;
  if (*(int *)&(this->super_ShaderProgram).field_0x154 == -1) {
    local_e8.m_data[0] = 1.0;
    local_e8.m_data[1] = 0.0;
    local_e8.m_data[2] = 0.0;
    local_e8.m_data[3] = 1.0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8._0_8_ = 0;
    local_b8._8_8_ = 0;
    if (this->m_geometryOut == 2) {
      tcu::operator*((tcu *)&local_c8,0.5,&local_e8);
      local_b8._0_8_ = CONCAT44(fStack_c4,local_c8);
      local_b8._8_8_ = CONCAT44(fStack_bc,fStack_c0);
      local_f8.m_data[1] = local_e8.m_data[0];
      local_f8.m_data[0] = local_e8.m_data[1];
      local_f8.m_data[2] = local_e8.m_data[2];
      local_f8.m_data[3] = local_e8.m_data[3];
      tcu::operator*((tcu *)&local_c8,0.5,&local_f8);
      local_a8 = CONCAT44(fStack_c4,local_c8);
      uStack_a0 = CONCAT44(fStack_bc,fStack_c0);
    }
    else if (this->m_geometryOut == 1) {
      local_b8._0_8_ = 0x3f800000;
      local_b8._8_8_ = 0x3f80000000000000;
    }
    pPVar3 = local_98;
    this_00 = local_d0;
    uVar4 = 0;
    uVar5 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      uVar5 = uVar4;
    }
    local_d8 = (PrimitivePacket *)(uVar5 * 0x38);
    for (; local_d8 != (PrimitivePacket *)uVar4; uVar4 = uVar4 + 0x38) {
      local_f8.m_data[0] = 0.0;
      local_f8.m_data[1] = 0.0;
      local_f8.m_data[2] = 0.0;
      local_f8.m_data[3] = 1.0;
      tcu::operator+((tcu *)&local_c8,&local_f8,&local_88);
      rr::GeometryEmitter::EmitVertex
                (this_00,(Vec4 *)&local_c8,1.0,(GenericVec4 *)&local_b8,
                 *(int *)((long)pPVar3->vertices + (uVar4 - 8)));
      local_f8.m_data[0] = 1.0;
      local_f8.m_data[1] = 0.0;
      local_f8.m_data[2] = 0.0;
      local_f8.m_data[3] = 1.0;
      tcu::operator+((tcu *)&local_c8,&local_f8,&local_88);
      rr::GeometryEmitter::EmitVertex
                (this_00,(Vec4 *)&local_c8,1.0,(GenericVec4 *)&local_b8,
                 *(int *)((long)pPVar3->vertices + (uVar4 - 8)));
      local_f8.m_data[0] = 1.0;
      local_f8.m_data[1] = 1.0;
      local_f8.m_data[2] = 0.0;
      local_f8.m_data[3] = 1.0;
      tcu::operator+((tcu *)&local_c8,&local_f8,&local_88);
      rr::GeometryEmitter::EmitVertex
                (this_00,(Vec4 *)&local_c8,1.0,(GenericVec4 *)&local_b8,
                 *(int *)((long)pPVar3->vertices + (uVar4 - 8)));
      rr::GeometryEmitter::EndPrimitive(this_00);
    }
  }
  else {
    local_70 = 0;
    uVar5 = (ulong)(uint)verticesIn;
    if (verticesIn < 1) {
      uVar5 = local_70;
    }
    local_78 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      local_78 = local_70;
    }
    ppVVar6 = packets->vertices;
    local_90 = uVar5;
    for (; local_70 != local_78; local_70 = local_70 + 1) {
      local_d8 = local_98 + local_70;
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        tcu::Vector<float,_4>::Vector(&local_e8);
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8.uData[0] = (deUint32)0.0;
        local_b8.uData[1] = (deUint32)0.0;
        local_b8.uData[2] = (deUint32)0.0;
        local_b8.uData[3] = (deUint32)0.0;
        iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar1 == 2) {
          local_58.m_data._0_8_ = *(undefined8 *)&ppVVar6[uVar4]->outputs[0].v;
          local_58.m_data._8_8_ = *(undefined8 *)((long)&ppVVar6[uVar4]->outputs[0].v + 8);
          tcu::operator*((tcu *)&local_f8,0.5,&local_58);
          pVVar2 = ppVVar6[uVar4];
          local_68.m_data[2] = (float)pVVar2[1].instanceNdx;
          local_68.m_data[1] = (float)pVVar2[1].vertexNdx;
          local_68.m_data[0] = pVVar2[1].position.m_data[0];
          local_68.m_data[3] = pVVar2[1].position.m_data[1];
          tcu::operator*(local_40,0.5,&local_68);
          tcu::operator+((tcu *)&local_c8,&local_f8,(Vector<float,_4> *)local_40);
          local_e8.m_data[0] = local_c8;
          local_e8.m_data[1] = fStack_c4;
          local_e8.m_data[2] = fStack_c0;
          local_e8.m_data[3] = fStack_bc;
LAB_003f482b:
        }
        else {
          if (iVar1 == 1) {
            pVVar2 = ppVVar6[uVar4];
            local_e8.m_data[0] = (float)pVVar2->outputs[0].v.uData[0];
            local_e8.m_data[1] = (float)pVVar2->outputs[0].v.uData[1];
            local_e8.m_data[2] = (float)pVVar2->outputs[0].v.uData[2];
            local_e8.m_data[3] = (float)pVVar2->outputs[0].v.uData[3];
            goto LAB_003f482b;
          }
          if (iVar1 == 0) {
            local_e8.m_data[0] = 1.0;
            local_e8.m_data[1] = 0.0;
            local_e8.m_data[2] = 0.0;
            local_e8.m_data[3] = 1.0;
            goto LAB_003f482b;
          }
        }
        if (this->m_geometryOut == 2) {
          tcu::operator*((tcu *)&local_c8,0.5,&local_e8);
          local_b8.uData[1] = (deUint32)fStack_c4;
          local_b8.uData[0] = (deUint32)local_c8;
          local_b8.uData[3] = (deUint32)fStack_bc;
          local_b8.uData[2] = (deUint32)fStack_c0;
          local_f8.m_data[1] = local_e8.m_data[0];
          local_f8.m_data[0] = local_e8.m_data[1];
          local_f8.m_data[2] = local_e8.m_data[2];
          local_f8.m_data[3] = local_e8.m_data[3];
          tcu::operator*((tcu *)&local_c8,0.5,&local_f8);
          local_a8 = CONCAT44(fStack_c4,local_c8);
          uStack_a0 = CONCAT44(fStack_bc,fStack_c0);
        }
        else if (this->m_geometryOut == 1) {
          local_b8.uData[0] = (deUint32)local_e8.m_data[0];
          local_b8.uData[1] = (deUint32)local_e8.m_data[1];
          local_b8.uData[2] = (deUint32)local_e8.m_data[2];
          local_b8.uData[3] = (deUint32)local_e8.m_data[3];
        }
        uVar5 = local_90;
        tcu::operator+((tcu *)&local_c8,&ppVVar6[uVar4]->position,&local_88);
        rr::GeometryEmitter::EmitVertex
                  (local_d0,(Vec4 *)&local_c8,ppVVar6[uVar4]->pointSize,(GenericVec4 *)&local_b8,
                   local_d8->primitiveIDIn);
      }
      rr::GeometryEmitter::EndPrimitive(local_d0);
      ppVVar6 = ppVVar6 + 7;
    }
  }
  return;
}

Assistant:

void VertexVaryingShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	const tcu::Vec4 vertexOffset(-0.2f, -0.2f, 0, 0);

	if (m_vertexOut == -1)
	{
		// vertex is a no-op
		const tcu::Vec4 inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		rr::GenericVec4	outputs[2];

		// output color
		switch (m_geometryOut)
		{
			case 0:
				break;

			case 1:
				outputs[0] = inputColor;
				break;

			case 2:
				outputs[0] = inputColor * 0.5f;
				outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			output.EmitVertex(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EndPrimitive();
		}
	}
	else
	{
		// vertex is not a no-op
		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
			{
				tcu::Vec4		inputColor;
				rr::GenericVec4	outputs[2];

				// input color
				switch (m_vertexOut)
				{
					case 0:
						inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
						break;

					case 1:
						inputColor = packets[ndx].vertices[verticeNdx]->outputs[0].get<float>();
						break;

					case 2:
						inputColor = (packets[ndx].vertices[verticeNdx]->outputs[0].get<float>() * 0.5f)
								   + (packets[ndx].vertices[verticeNdx]->outputs[1].get<float>().swizzle(2, 1, 0, 3) * 0.5f);
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				// output color
				switch (m_geometryOut)
				{
					case 0:
						break;

					case 1:
						outputs[0] = inputColor;
						break;

					case 2:
						outputs[0] = inputColor * 0.5f;
						outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				output.EmitVertex(packets[ndx].vertices[verticeNdx]->position + vertexOffset, packets[ndx].vertices[verticeNdx]->pointSize, outputs, packets[ndx].primitiveIDIn);
			}
			output.EndPrimitive();
		}
	}
}